

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gls::BuiltinPrecisionTests::InputLess<tcu::Matrix<float,_4,_2>_>::operator()
          (InputLess<tcu::Matrix<float,_4,_2>_> *this,Matrix<float,_4,_2> *mat1,
          Matrix<float,_4,_2> *mat2)

{
  bool bVar1;
  Vector<float,_4> *pVVar2;
  Vector<float,_4> *pVVar3;
  int local_2c;
  int col;
  Matrix<float,_4,_2> *mat2_local;
  Matrix<float,_4,_2> *mat1_local;
  InputLess<tcu::Matrix<float,_4,_2>_> *this_local;
  
  local_2c = 0;
  while( true ) {
    if (1 < local_2c) {
      return false;
    }
    pVVar2 = tcu::Matrix<float,_4,_2>::operator[](mat1,local_2c);
    pVVar3 = tcu::Matrix<float,_4,_2>::operator[](mat2,local_2c);
    bVar1 = inputLess<tcu::Vector<float,4>>(pVVar2,pVVar3);
    if (bVar1) break;
    pVVar2 = tcu::Matrix<float,_4,_2>::operator[](mat2,local_2c);
    pVVar3 = tcu::Matrix<float,_4,_2>::operator[](mat1,local_2c);
    bVar1 = inputLess<tcu::Vector<float,4>>(pVVar2,pVVar3);
    if (bVar1) {
      return false;
    }
    local_2c = local_2c + 1;
  }
  return true;
}

Assistant:

bool operator() (const Matrix<T, Rows, Cols>& mat1,
					 const Matrix<T, Rows, Cols>& mat2) const
	{
		for (int col = 0; col < Cols; ++col)
		{
			if (inputLess(mat1[col], mat2[col]))
				return true;
			if (inputLess(mat2[col], mat1[col]))
				return false;
		}

		return false;
	}